

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void whereInfoFree(sqlite3 *db,WhereInfo *pWInfo)

{
  WhereLoop *p;
  WhereMemBlock *pWVar1;
  WhereMemBlock *p_00;
  
  sqlite3WhereClauseClear(&pWInfo->sWC);
  while (p = pWInfo->pLoops, p != (WhereLoop *)0x0) {
    pWInfo->pLoops = p->pNextLoop;
    whereLoopDelete(db,p);
  }
  p_00 = pWInfo->pMemToFree;
  while (p_00 != (WhereMemBlock *)0x0) {
    pWVar1 = p_00->pNext;
    sqlite3DbNNFreeNN(db,p_00);
    pWInfo->pMemToFree = pWVar1;
    p_00 = pWVar1;
  }
  sqlite3DbNNFreeNN(db,pWInfo);
  return;
}

Assistant:

static void whereInfoFree(sqlite3 *db, WhereInfo *pWInfo){
  assert( pWInfo!=0 );
  assert( db!=0 );
  sqlite3WhereClauseClear(&pWInfo->sWC);
  while( pWInfo->pLoops ){
    WhereLoop *p = pWInfo->pLoops;
    pWInfo->pLoops = p->pNextLoop;
    whereLoopDelete(db, p);
  }
  while( pWInfo->pMemToFree ){
    WhereMemBlock *pNext = pWInfo->pMemToFree->pNext;
    sqlite3DbNNFreeNN(db, pWInfo->pMemToFree);
    pWInfo->pMemToFree = pNext;
  }
  sqlite3DbNNFreeNN(db, pWInfo);
}